

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CQuad,_allocator_default<CQuad>_>::clear(array<CQuad,_allocator_default<CQuad>_> *this)

{
  CPoint CVar1;
  CQuad *in_RDI;
  
  allocator_default<CQuad>::free_array(in_RDI);
  in_RDI->m_aPoints[1].x = 1;
  CVar1 = (CPoint)allocator_default<CQuad>::alloc_array(0);
  in_RDI->m_aPoints[0] = CVar1;
  in_RDI->m_aPoints[1].y = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}